

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void save_mb_rd_info(int n4,uint32_t hash,MACROBLOCK *x,RD_STATS *rd_stats,
                    MB_RD_RECORD *mb_rd_record)

{
  long lVar1;
  undefined1 *puVar2;
  void *in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  int in_EDI;
  long in_R8;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MB_RD_INFO *mb_rd_info;
  int index;
  int local_24;
  
  if (*(int *)(in_R8 + 0x4244) < 8) {
    local_24 = (*(int *)(in_R8 + 0x4240) + *(int *)(in_R8 + 0x4244)) % 8;
    *(int *)(in_R8 + 0x4244) = *(int *)(in_R8 + 0x4244) + 1;
  }
  else {
    local_24 = *(int *)(in_R8 + 0x4240);
    *(int *)(in_R8 + 0x4240) = (*(int *)(in_R8 + 0x4240) + 1) % 8;
  }
  puVar2 = (undefined1 *)(in_R8 + (long)local_24 * 0x848);
  lVar1 = **(long **)(in_RDX + 0x2058);
  *(undefined4 *)(puVar2 + 0x840) = in_ESI;
  *puVar2 = *(undefined1 *)(lVar1 + 0x91);
  memcpy(puVar2 + 0x11,(void *)(in_RDX + 0x24e09),(long)in_EDI);
  *(undefined8 *)(puVar2 + 1) = *(undefined8 *)(lVar1 + 0x92);
  *(undefined8 *)(puVar2 + 9) = *(undefined8 *)(lVar1 + 0x9a);
  memcpy(puVar2 + 0x411,*(void **)(in_RDX + 0x2088),(long)in_EDI);
  memcpy(puVar2 + 0x818,in_RCX,0x28);
  return;
}

Assistant:

static inline void save_mb_rd_info(int n4, uint32_t hash,
                                   const MACROBLOCK *const x,
                                   const RD_STATS *const rd_stats,
                                   MB_RD_RECORD *mb_rd_record) {
  int index;
  if (mb_rd_record->num < RD_RECORD_BUFFER_LEN) {
    index =
        (mb_rd_record->index_start + mb_rd_record->num) % RD_RECORD_BUFFER_LEN;
    ++mb_rd_record->num;
  } else {
    index = mb_rd_record->index_start;
    mb_rd_record->index_start =
        (mb_rd_record->index_start + 1) % RD_RECORD_BUFFER_LEN;
  }
  MB_RD_INFO *const mb_rd_info = &mb_rd_record->mb_rd_info[index];
  const MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  mb_rd_info->hash_value = hash;
  mb_rd_info->tx_size = mbmi->tx_size;
  memcpy(mb_rd_info->blk_skip, x->txfm_search_info.blk_skip,
         sizeof(mb_rd_info->blk_skip[0]) * n4);
  av1_copy(mb_rd_info->inter_tx_size, mbmi->inter_tx_size);
  av1_copy_array(mb_rd_info->tx_type_map, xd->tx_type_map, n4);
  mb_rd_info->rd_stats = *rd_stats;
}